

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_interface_generic.c
# Opt level: O0

os_interface_ip * os_interface_generic_get_prefix_from_dst(netaddr *destination,os_interface *os_if)

{
  list_entity *plVar1;
  list_entity *plVar2;
  avl_tree *paVar3;
  os_interface_ip *poVar4;
  ulong uVar5;
  list_entity *__tempptr_5;
  list_entity *__tempptr_4;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  os_interface_ip *ip;
  os_interface *os_if_local;
  netaddr *destination_local;
  
  if (os_if == (os_interface *)0x0) {
    paVar3 = os_interface_linux_get_tree();
    plVar1 = (paVar3->list_head).next;
    while( true ) {
      ip = (os_interface_ip *)&plVar1[-0xd].prev;
      plVar2 = plVar1->prev;
      paVar3 = os_interface_linux_get_tree();
      if (plVar2 == (paVar3->list_head).prev) break;
      poVar4 = os_interface_generic_get_prefix_from_dst(destination,(os_interface *)ip);
      if (poVar4 != (os_interface_ip *)0x0) {
        return poVar4;
      }
      plVar1 = plVar1->next;
    }
  }
  else {
    for (__tempptr = (os_if->addresses).list_head.next;
        __tempptr->prev != (os_if->addresses).list_head.prev; __tempptr = __tempptr->next) {
      uVar5 = netaddr_is_in_subnet((undefined1 *)((long)&__tempptr[5].prev + 4),destination);
      if ((uVar5 & 1) != 0) {
        return (os_interface_ip *)__tempptr;
      }
    }
  }
  return (os_interface_ip *)0x0;
}

Assistant:

const struct os_interface_ip *
os_interface_generic_get_prefix_from_dst(struct netaddr *destination, struct os_interface *os_if) {
  const struct os_interface_ip *ip;

  if (os_if == NULL) {
    avl_for_each_element(os_interface_get_tree(), os_if, _node) {
      ip = os_interface_get_prefix_from_dst(destination, os_if);
      if (ip) {
        return ip;
      }
    }
    return NULL;
  }

  avl_for_each_element(&os_if->addresses, ip, _node) {
    if (netaddr_is_in_subnet(&ip->prefix, destination)) {
      return ip;
    }
  }

  return NULL;
}